

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O2

Gia_Man_t * Gia_ManRebuild(Gia_Man_t *p,Dsd_Manager_t *pManDsd,DdManager *ddNew)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Dsd_Node_t *pDVar7;
  Gia_Obj_t *pGVar8;
  Dsd_Node_t **__ptr;
  ulong uVar9;
  uint v;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int nNodesDsd;
  Vec_Str_t *local_50;
  Vec_Str_t *local_48;
  Vec_Int_t *local_40;
  DdManager *local_38;
  
  local_38 = ddNew;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  local_40 = pVVar4;
  local_48 = Vec_StrAlloc(10000);
  local_50 = Vec_StrAlloc(1000);
  p_00 = Gia_ManStart(p->nObjs * 2);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar6;
  Gia_ManHashAlloc(p_00);
  pDVar7 = Dsd_ManagerReadConst1(pManDsd);
  Dsd_NodeSetMark(pDVar7,1);
  for (iVar10 = 0; iVar10 < p->vCis->nSize; iVar10 = iVar10 + 1) {
    pDVar7 = Dsd_ManagerReadInput(pManDsd,iVar10);
    pGVar8 = Gia_ManAppendObj(p_00);
    uVar1 = *(ulong *)pGVar8;
    *(ulong *)pGVar8 = uVar1 | 0x9fffffff;
    *(ulong *)pGVar8 =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar4 = p_00->vCis;
    iVar2 = Gia_ObjId(p_00,pGVar8);
    Vec_IntPush(pVVar4,iVar2);
    iVar2 = Gia_ObjId(p_00,pGVar8);
    Dsd_NodeSetMark(pDVar7,iVar2 * 2);
  }
  __ptr = Dsd_TreeCollectNodesDfs(pManDsd,&nNodesDsd);
  pVVar4 = local_40;
  lVar12 = 0;
  iVar10 = -1;
  do {
    if (nNodesDsd <= lVar12) goto LAB_00542213;
    iVar10 = Gia_ManRebuildNode(pManDsd,__ptr[lVar12],p_00,local_38,pVVar4,local_48,local_50);
    lVar12 = lVar12 + 1;
  } while (iVar10 != -1);
  iVar10 = -1;
LAB_00542213:
  free(__ptr);
  free(pVVar4->pArray);
  free(pVVar4);
  Vec_StrFree(local_48);
  Vec_StrFree(local_50);
  if (iVar10 == -1) {
    Gia_ManStop(p_00);
    p_00 = Gia_ManDup(p);
  }
  else {
    for (iVar10 = 0; iVar10 < p->vCos->nSize; iVar10 = iVar10 + 1) {
      pDVar7 = Dsd_ManagerReadRoot(pManDsd,iVar10);
      iVar2 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pDVar7 & 0xfffffffffffffffe));
      uVar3 = Abc_LitNotCond(iVar2,(uint)pDVar7 & 1);
      v = uVar3 >> 1;
      if (p_00->nObjs <= (int)v) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x2d6,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar8 = Gia_ManObj(p_00,v);
      if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && (int)*(uint *)pGVar8 < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x2d7,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar8 = Gia_ManAppendObj(p_00);
      *(ulong *)pGVar8 = *(ulong *)pGVar8 | 0x80000000;
      iVar2 = Gia_ObjId(p_00,pGVar8);
      uVar9 = (ulong)(iVar2 - v & 0x1fffffff);
      uVar1 = *(ulong *)pGVar8;
      uVar11 = (ulong)((uVar3 & 1) << 0x1d);
      *(ulong *)pGVar8 = uVar11 | uVar1 & 0xffffffffc0000000 | uVar9;
      *(ulong *)pGVar8 =
           uVar11 | uVar1 & 0xe0000000c0000000 | uVar9 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pVVar4 = p_00->vCos;
      iVar2 = Gia_ObjId(p_00,pGVar8);
      Vec_IntPush(pVVar4,iVar2);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff),pGVar8);
      }
      Gia_ObjId(p_00,pGVar8);
    }
    Gia_ManSetRegNum(p_00,p->nRegs);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManRebuild( Gia_Man_t * p, Dsd_Manager_t * pManDsd, DdManager * ddNew )
{
    Gia_Man_t * pNew;
    Dsd_Node_t ** ppNodesDsd;
    Dsd_Node_t * pNodeDsd;
    int i, nNodesDsd, iLit = -1;
    Vec_Str_t * vSop, * vCube;
    Vec_Int_t * vFanins;

    vFanins = Vec_IntAlloc( 1000 );
    vSop    = Vec_StrAlloc( 10000 );
    vCube   = Vec_StrAlloc( 1000 );

    pNew = Gia_ManStart( 2*Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );

    // save the CI nodes in the DSD nodes
    Dsd_NodeSetMark( Dsd_ManagerReadConst1(pManDsd), 1 );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
    {
        pNodeDsd = Dsd_ManagerReadInput( pManDsd, i );
        Dsd_NodeSetMark( pNodeDsd, Gia_ManAppendCi( pNew ) );
    }

    // collect DSD nodes in DFS order (leaves and const1 are not collected)
    ppNodesDsd = Dsd_TreeCollectNodesDfs( pManDsd, &nNodesDsd );
    for ( i = 0; i < nNodesDsd; i++ )
    {
        iLit = Gia_ManRebuildNode( pManDsd, ppNodesDsd[i], pNew, ddNew, vFanins, vSop, vCube );
        if ( iLit == -1 )
            break;
    }
    ABC_FREE( ppNodesDsd );
    Vec_IntFree( vFanins );
    Vec_StrFree( vSop );
    Vec_StrFree( vCube );
    if ( iLit == -1 )
    {
        Gia_ManStop( pNew );
        return Gia_ManDup(p);
    }

    // set the pointers to the CO drivers
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
    {
        pNodeDsd = Dsd_ManagerReadRoot( pManDsd, i );
        iLit = Dsd_NodeReadMark( Dsd_Regular(pNodeDsd) );
        iLit = Abc_LitNotCond( iLit, Dsd_IsComplement(pNodeDsd) );
        Gia_ManAppendCo( pNew, iLit );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}